

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

Expectation __thiscall
testing::internal::UntypedFunctionMockerBase::GetHandleOf
          (UntypedFunctionMockerBase *this,ExpectationBase *exp)

{
  FailureReporterInterface *pFVar1;
  ExpectationBase *in_RDX;
  linked_ptr_internal *extraout_RDX;
  linked_ptr_internal *extraout_RDX_00;
  linked_ptr_internal lVar2;
  linked_ptr<testing::internal::ExpectationBase> *an_expectation_base;
  Expectation EVar3;
  long *local_30 [2];
  long local_20 [2];
  
  an_expectation_base =
       *(linked_ptr<testing::internal::ExpectationBase> **)((long)&(exp->source_text_).field_2 + 8);
  do {
    if (an_expectation_base ==
        *(linked_ptr<testing::internal::ExpectationBase> **)&exp->cardinality_specified_) {
      local_30[0] = local_20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_30,"Cannot find expectation.","");
      pFVar1 = GetFailureReporter();
      (*pFVar1->_vptr_FailureReporterInterface[2])
                (pFVar1,1,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/thirdparty/gmock/gmock-gtest-all.cc"
                 ,0x2aa1,local_30);
      if (local_30[0] != local_20) {
        operator_delete(local_30[0],local_20[0] + 1);
      }
      Expectation::Expectation((Expectation *)this);
      lVar2.next_ = extraout_RDX;
LAB_00144800:
      EVar3.expectation_base_.link_.next_ = lVar2.next_;
      EVar3.expectation_base_.value_ = (ExpectationBase *)this;
      return (Expectation)EVar3.expectation_base_;
    }
    if (an_expectation_base->value_ == in_RDX) {
      Expectation::Expectation((Expectation *)this,an_expectation_base);
      lVar2.next_ = extraout_RDX_00;
      goto LAB_00144800;
    }
    an_expectation_base = an_expectation_base + 1;
  } while( true );
}

Assistant:

Expectation UntypedFunctionMockerBase::GetHandleOf(ExpectationBase* exp) {
  for (UntypedExpectations::const_iterator it =
           untyped_expectations_.begin();
       it != untyped_expectations_.end(); ++it) {
    if (it->get() == exp) {
      return Expectation(*it);
    }
  }

  Assert(false, __FILE__, __LINE__, "Cannot find expectation.");
  return Expectation();
  // The above statement is just to make the code compile, and will
  // never be executed.
}